

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-formulas.c
# Opt level: O2

_Bool borg_load_formulas(ang_file *fp)

{
  _Bool _Var1;
  undefined1 uVar2;
  char *s;
  size_t sVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  uint uStack_490;
  uint local_488;
  char *s_reward;
  char *s_value;
  char *s_range;
  char buf [1024];
  
  borg_formulas.restock.count = 0;
  borg_formulas.depth.count = 0;
  borg_formulas.power.count = 0;
  bVar4 = borg_cfg[0xd] == 0;
  bVar6 = true;
  local_488 = 0;
  while (_Var1 = file_getl(fp,buf,0x3ff), _Var1) {
    s = borg_trim(buf);
    if ((*s != '\0') && (*s != '#')) {
      _Var1 = prefix_i(s,"[END FORMULA SECTION]");
      if (_Var1) break;
      if (!bVar4) {
        if (*s == ']') {
          bVar5 = local_488 == 0;
          local_488 = 0;
          if (bVar5) {
            return false;
          }
        }
        else if (*s == '[') {
          if (!bVar6) {
            bVar4 = true;
          }
          bVar6 = false;
        }
        else {
          _Var1 = prefix_i(s,"Power");
          if (_Var1) {
            bVar6 = local_488 != 0;
            local_488 = 1;
            if (bVar6) {
              bVar4 = true;
            }
          }
          else {
            _Var1 = prefix_i(s,"Depth Requirement");
            if (_Var1) {
              if (local_488 != 0) {
                bVar4 = true;
              }
              uStack_490 = 2;
              local_488 = uStack_490;
            }
            else {
              _Var1 = prefix_i(s,"Restock Requirement");
              if (!_Var1) {
                sVar3 = strlen(s);
                if (s[sVar3 - 1] == ';') {
                  uVar2 = (*(code *)(&DAT_0026f5b8 + *(int *)(&DAT_0026f5b8 + (ulong)local_488 * 4))
                          )();
                  return (_Bool)uVar2;
                }
                uVar2 = (*(code *)(&DAT_0026f5a8 + *(int *)(&DAT_0026f5a8 + (ulong)local_488 * 4)))
                                  ();
                return (_Bool)uVar2;
              }
              if (local_488 != 0) {
                bVar4 = true;
              }
              uStack_490 = 3;
              local_488 = uStack_490;
            }
          }
          bVar6 = true;
        }
      }
    }
  }
  if (!bVar4) {
    return false;
  }
  if (borg_cfg[0xd] == 0) {
    return true;
  }
  borg_cfg[0xd] = 0;
  return true;
}

Assistant:

bool borg_load_formulas(ang_file *fp)
{
    enum e_section { SEC_NONE, SEC_POWER, SEC_DEPTH, SEC_RESTOCK };

    char           buf[1024];
    bool           formulas_off = false;
    enum e_section section      = SEC_NONE;
    bool           skip_open    = true;

    borg_formulas.restock.count = 0;
    borg_formulas.depth.count   = 0;
    borg_formulas.power.count   = 0;

    /* read but don't process formulas if we aren't using them */
    if (!borg_cfg[BORG_USES_DYNAMIC_CALCS])
        formulas_off = true;

    /* Parse the formula section of the file */
    while (file_getl(fp, buf, sizeof(buf) - 1)) {

        char *line = borg_trim(buf);

        /* Skip comments and blank lines */
        if (!line[0] || (line[0] == '#'))
            continue;

        if (prefix_i(line, "[END FORMULA SECTION]"))
            break;

        /* if we failed anywhere */
        if (formulas_off)
            continue;

        /* sections are bounded in [] */
        if (line[0] == '[') {
            if (!skip_open)
                formulas_off = true;

            skip_open = false;
            continue;
        }
        if (line[0] == ']') {
            if (section == SEC_NONE)
                return formulas_off;
            section = SEC_NONE;
            continue;
        }

        /* if we failed anywhere */
        if (formulas_off)
            continue;

        if (prefix_i(line, "Power")) {
            if (section != SEC_NONE)
                formulas_off = true;

            section   = SEC_POWER;
            skip_open = true;
            continue;
        }
        if (prefix_i(line, "Depth Requirement")) {
            if (section != SEC_NONE)
                formulas_off = true;

            section   = SEC_DEPTH;
            skip_open = true;
            continue;
        }
        if (prefix_i(line, "Restock Requirement")) {
            if (section != SEC_NONE)
                formulas_off = true;

            section   = SEC_RESTOCK;
            skip_open = true;
            continue;
        }

        /* lines must end in ; */
        if (line[strlen(line) - 1] != ';') {
            if (section == SEC_DEPTH)
                borg_formula_error(
                    buf, buf, "depth", "** line must end in a ;");
            else if (section == SEC_POWER)
                borg_formula_error(
                    buf, buf, "power", "** line must end in a ;");
            else if (section == SEC_RESTOCK)
                borg_formula_error(
                    buf, buf, "restock", "** line must end in a ;");
            else
                borg_formula_error(buf, buf, "base", "** line must end in a ;");
            formulas_off = true;
        } else {
            if (section == SEC_DEPTH)
                formulas_off = parse_depth_line(false, line, buf);
            if (section == SEC_RESTOCK)
                formulas_off = parse_depth_line(true, line, buf);
            if (section == SEC_POWER)
                formulas_off = parse_power_line(line, buf);
            if (section == SEC_NONE) {
                borg_formula_error(buf, buf, "base",
                    "** line must be part of a Power or Depth section");
                formulas_off = true;
            }
        }
    }
    if (formulas_off && borg_cfg[BORG_USES_DYNAMIC_CALCS])
        borg_cfg[BORG_USES_DYNAMIC_CALCS] = false;

    return formulas_off;
}